

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCursor(Btree *p,int iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  BtShared *pBVar1;
  BtCursor *pBVar2;
  int iVar3;
  u8 *puVar4;
  BtCursor **ppBVar5;
  BtCursor **ppBVar6;
  
  if (iTable < 1) {
    iVar3 = sqlite3CorruptError(0x1080c);
    return iVar3;
  }
  sqlite3BtreeEnter(p);
  pBVar1 = p->pBt;
  if ((wrFlag != 0) && (pBVar1->pTmpSpace == (u8 *)0x0)) {
    puVar4 = (u8 *)pcache1Alloc(pBVar1->pageSize);
    pBVar1->pTmpSpace = puVar4;
    if (puVar4 == (u8 *)0x0) {
      iVar3 = 7;
      goto LAB_0015638d;
    }
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    pBVar1->pTmpSpace = pBVar1->pTmpSpace + 4;
  }
  if (iTable == 1) {
    iTable = (int)(pBVar1->nPage != 0);
  }
  pCur->pgnoRoot = iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBVar1;
  pCur->curFlags = wrFlag != 0;
  pCur->curPagerFlags = (wrFlag == 0) * '\x02';
  ppBVar6 = &pBVar1->pCursor;
  ppBVar5 = ppBVar6;
  while (pBVar2 = *ppBVar5, pBVar2 != (BtCursor *)0x0) {
    if (pBVar2->pgnoRoot == iTable) {
      pBVar2->curFlags = pBVar2->curFlags | 0x20;
      pCur->curFlags = pCur->curFlags | 0x20;
    }
    ppBVar5 = &pBVar2->pNext;
  }
  pCur->pNext = *ppBVar6;
  *ppBVar6 = pCur;
  pCur->eState = '\x01';
  iVar3 = 0;
LAB_0015638d:
  sqlite3BtreeLeave(p);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  int iTable,                                 /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  int rc;
  if( iTable<1 ){
    rc = SQLITE_CORRUPT_BKPT;
  }else{
    sqlite3BtreeEnter(p);
    rc = btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
    sqlite3BtreeLeave(p);
  }
  return rc;
}